

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

int uv_udp_set_source_membership
              (uv_udp_t *handle,char *multicast_addr,char *interface_addr,char *source_addr,
              uv_membership membership)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  sockaddr_in6 *psVar4;
  char *pcVar5;
  undefined8 *puVar6;
  byte bVar7;
  sockaddr_storage src_addr;
  sockaddr_storage mcast_addr;
  sockaddr_in6 local_254;
  sockaddr local_238;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined8 local_1b0 [17];
  sockaddr_in6 local_128 [4];
  sockaddr_in6 local_a8 [4];
  
  bVar7 = 0;
  iVar1 = uv_ip4_addr(multicast_addr,0,(sockaddr_in *)local_a8);
  if (iVar1 == 0) {
    iVar1 = uv_ip4_addr(source_addr,0,(sockaddr_in *)local_128);
    if (iVar1 != 0) {
      return iVar1;
    }
    if ((handle->io_watcher).fd == -1) {
      local_238.sa_data[6] = '\0';
      local_238.sa_data[7] = '\0';
      local_238.sa_data[8] = '\0';
      local_238.sa_data[9] = '\0';
      local_238.sa_data[10] = '\0';
      local_238.sa_data[0xb] = '\0';
      local_238.sa_data[0xc] = '\0';
      local_238.sa_data[0xd] = '\0';
      local_238.sa_family = 2;
      local_238.sa_data[0] = '\0';
      local_238.sa_data[1] = '\0';
      local_238.sa_data[2] = '\0';
      local_238.sa_data[3] = '\0';
      local_238.sa_data[4] = '\0';
      local_238.sa_data[5] = '\0';
      iVar1 = uv__udp_bind(handle,&local_238,0x10,4);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    local_238.sa_data[6] = '\0';
    local_238.sa_data[7] = '\0';
    local_238.sa_data[8] = '\0';
    local_238.sa_data[9] = '\0';
    local_238.sa_family = 0;
    local_238.sa_data[0] = '\0';
    local_238.sa_data[1] = '\0';
    local_238.sa_data[2] = '\0';
    local_238.sa_data[3] = '\0';
    local_238.sa_data[4] = '\0';
    local_238.sa_data[5] = '\0';
    if ((interface_addr != (char *)0x0) &&
       (iVar1 = uv_inet_pton(2,interface_addr,local_238.sa_data + 2), iVar1 != 0)) {
      return iVar1;
    }
    local_238._0_4_ = local_a8[0].sin6_flowinfo;
    local_238.sa_data[6] = (undefined1)local_128[0].sin6_flowinfo;
    local_238.sa_data[7] = local_128[0].sin6_flowinfo._1_1_;
    local_238.sa_data[8] = local_128[0].sin6_flowinfo._2_1_;
    local_238.sa_data[9] = local_128[0].sin6_flowinfo._3_1_;
    if (membership == UV_JOIN_GROUP) {
      iVar1 = 0x27;
    }
    else {
      if (membership != UV_LEAVE_GROUP) {
        return -0x16;
      }
      iVar1 = 0x28;
    }
    iVar1 = setsockopt((handle->io_watcher).fd,0,iVar1,&local_238,0xc);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    iVar1 = uv_ip6_addr(multicast_addr,0,local_a8);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = uv_ip6_addr(source_addr,0,local_128);
    if (iVar1 != 0) {
      return iVar1;
    }
    if ((handle->io_watcher).fd == -1) {
      uStack_220 = 0;
      local_238.sa_family = 10;
      local_238.sa_data[0] = '\0';
      local_238.sa_data[1] = '\0';
      local_238.sa_data[2] = '\0';
      local_238.sa_data[3] = '\0';
      local_238.sa_data[4] = '\0';
      local_238.sa_data[5] = '\0';
      local_238.sa_data._6_4_ = SUB84(_in6addr_any,0);
      local_238.sa_data._10_4_ = SUB84((ulong)_in6addr_any >> 0x20,0);
      uStack_228 = (undefined4)_isatty;
      uStack_224 = (undefined4)((ulong)_isatty >> 0x20);
      iVar1 = uv__udp_bind(handle,&local_238,0x1c,4);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    local_238.sa_family = 0;
    local_238.sa_data[0] = '\0';
    local_238.sa_data[1] = '\0';
    local_238.sa_data[2] = '\0';
    local_238.sa_data[3] = '\0';
    local_238.sa_data[4] = '\0';
    local_238.sa_data[5] = '\0';
    if (interface_addr == (char *)0x0) {
      local_254.sin6_scope_id = 0;
    }
    else {
      iVar1 = uv_ip6_addr(interface_addr,0,&local_254);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    local_238._0_4_ = local_254.sin6_scope_id;
    psVar4 = local_a8;
    pcVar5 = local_238.sa_data + 6;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(undefined8 *)pcVar5 = *(undefined8 *)psVar4;
      psVar4 = (sockaddr_in6 *)((long)psVar4 + ((ulong)bVar7 * -2 + 1) * 8);
      pcVar5 = pcVar5 + ((ulong)bVar7 * -2 + 1) * 8;
    }
    psVar4 = local_128;
    puVar6 = local_1b0;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar6 = *(undefined8 *)psVar4;
      psVar4 = (sockaddr_in6 *)((long)psVar4 + ((ulong)bVar7 * -2 + 1) * 8);
      puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
    }
    if (membership == UV_JOIN_GROUP) {
      iVar1 = 0x2e;
    }
    else {
      if (membership != UV_LEAVE_GROUP) {
        return -0x16;
      }
      iVar1 = 0x2f;
    }
    iVar1 = setsockopt((handle->io_watcher).fd,0x29,iVar1,&local_238,0x108);
    if (iVar1 == 0) {
      return 0;
    }
  }
  piVar2 = __errno_location();
  return -*piVar2;
}

Assistant:

int uv_udp_set_source_membership(uv_udp_t* handle,
                                 const char* multicast_addr,
                                 const char* interface_addr,
                                 const char* source_addr,
                                 uv_membership membership) {
#if !defined(__OpenBSD__) && !defined(__NetBSD__) && !defined(__ANDROID__)
  int err;
  struct sockaddr_storage mcast_addr;
  struct sockaddr_in* mcast_addr4;
  struct sockaddr_in6* mcast_addr6;
  struct sockaddr_storage src_addr;
  struct sockaddr_in* src_addr4;
  struct sockaddr_in6* src_addr6;

  mcast_addr4 = (struct sockaddr_in*)&mcast_addr;
  mcast_addr6 = (struct sockaddr_in6*)&mcast_addr;
  src_addr4 = (struct sockaddr_in*)&src_addr;
  src_addr6 = (struct sockaddr_in6*)&src_addr;

  err = uv_ip4_addr(multicast_addr, 0, mcast_addr4);
  if (err) {
    err = uv_ip6_addr(multicast_addr, 0, mcast_addr6);
    if (err)
      return err;
    err = uv_ip6_addr(source_addr, 0, src_addr6);
    if (err)
      return err;
    return uv__udp_set_source_membership6(handle,
                                          mcast_addr6,
                                          interface_addr,
                                          src_addr6,
                                          membership);
  }

  err = uv_ip4_addr(source_addr, 0, src_addr4);
  if (err)
    return err;
  return uv__udp_set_source_membership4(handle,
                                        mcast_addr4,
                                        interface_addr,
                                        src_addr4,
                                        membership);
#else
  return UV_ENOSYS;
#endif
}